

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O2

uint128 absl::lts_20240722::operator^(uint128 lhs,uint128 rhs)

{
  uint128 uVar1;
  
  uVar1.lo_ = lhs.lo_ ^ rhs.lo_;
  uVar1.hi_ = lhs.hi_ ^ rhs.hi_;
  return uVar1;
}

Assistant:

constexpr inline uint128 operator^(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return static_cast<unsigned __int128>(lhs) ^
         static_cast<unsigned __int128>(rhs);
#else
  return MakeUint128(Uint128High64(lhs) ^ Uint128High64(rhs),
                     Uint128Low64(lhs) ^ Uint128Low64(rhs));
#endif
}